

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VehicleState.cc
# Opt level: O0

void __thiscall
VehicleState::Propagator::operator()(Propagator *this,state_type *x,state_type *dxdt,double t)

{
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  const_reference pvVar1;
  reference pvVar2;
  Scalar *pSVar3;
  Vector3d *pos_00;
  Scalar *pSVar4;
  Scalar *pSVar5;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  byte *in_RDI;
  double in_XMM0_Qa;
  double dVar6;
  double dVar7;
  __type _Var8;
  double dVar9;
  Vector3d *vel_00;
  double dVar10;
  double dVar11;
  double dVar12;
  RealScalar RVar13;
  RealScalar RVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  VectorXd eigcol_1;
  int ii_1;
  MatrixXd dSTM;
  VectorXd eigcol;
  vector<double,_std::allocator<double>_> col;
  int ii;
  MatrixXd STM;
  MatrixXd jac;
  Vector3d eigvel;
  Vector3d eigpos;
  double drag_coeff;
  double rho_A_1;
  double r3earth2moon;
  double r3craft2moon;
  double r3earth2sun;
  double r3craft2sun;
  double r_1;
  double r2_1;
  double r_moon_ECI_norm;
  double eps_1;
  double D;
  double phi_ecliptic;
  double lambda_ecliptic_1;
  double T_TBD;
  Vector3d r_craft2sun_norm;
  double p_srp;
  double SRPcoeff;
  double pen_vert;
  double x_1;
  double sat_vert;
  double sat_horiz;
  double xi;
  double alpha_pen;
  double sundotcraft;
  bool in_sun;
  double eps;
  double r_sun_ECI_norm;
  double lambda_ecliptic;
  double M_sun;
  double lambda_M_sun;
  double T_UT1;
  double rho_A;
  double nV_A;
  Vector3d V_A;
  double accel_j2_z;
  double accel_j2_y;
  double accel_j2_x;
  double t4;
  double t3;
  double t2;
  double k;
  Vector3d accelinit;
  state_type accel;
  double d2r;
  double JD_UTC;
  double r;
  double r2;
  Vector3d r_craft;
  Vector3d r_craft2moon;
  Vector3d r_moon_ECI;
  Vector3d r_craft2sun;
  Vector3d r_sun_ECI;
  double mu_moon;
  double mu_sun;
  double AU2km;
  double t_JD_init;
  double H;
  double r0;
  double rho_0;
  double m;
  double A;
  double C_D;
  double earthrot;
  state_type vel;
  state_type pos;
  double J3;
  double J2;
  double Rearth;
  double mu;
  EigenBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
  *in_stack_fffffffffffff248;
  value_type vVar21;
  MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffff250;
  allocator_type *in_stack_fffffffffffff258;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff260;
  vector<double,_std::allocator<double>_> *this_00;
  Scalar *in_stack_fffffffffffff268;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffff270;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffff278;
  Matrix<double,_3,_1,_0,_3,_1> *in_stack_fffffffffffff280;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff288;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffff290;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffff298;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff2a0;
  Scalar SVar22;
  double in_stack_fffffffffffff718;
  Vector3d *in_stack_fffffffffffff720;
  EGM96Grav *in_stack_fffffffffffff728;
  int local_584;
  vector<double,_std::allocator<double>_> local_4e8;
  int local_4cc;
  double *local_450;
  double *local_430;
  double local_410;
  double local_408;
  double local_400;
  double local_3f8;
  double local_3f0;
  double local_3e8;
  double local_3e0;
  double local_3d8;
  double local_3b8;
  double local_3b0;
  double local_3a8;
  double local_3a0;
  double local_398;
  double local_390;
  RealScalar local_388;
  double local_348;
  double local_340;
  double local_338;
  double local_330;
  double local_328;
  double local_320;
  double local_318;
  double local_310;
  ReturnType local_308;
  byte local_2f9;
  double local_2e0;
  double local_2d8;
  double local_2d0;
  double local_2c8;
  double local_2c0;
  double local_2b8;
  double local_2b0;
  RealScalar local_2a8;
  double local_288;
  double local_280;
  double local_278;
  __type local_270;
  __type local_268;
  __type local_260;
  double local_258;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 *local_1f8;
  undefined8 local_1f0;
  vector<double,_std::allocator<double>_> local_1e8;
  double local_1d0;
  double local_1c8;
  double local_1c0;
  double local_1b8;
  double local_138;
  double local_130;
  double local_128;
  double local_120;
  double local_118;
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  value_type local_d8;
  value_type local_d0;
  value_type local_c8;
  value_type *local_c0;
  undefined8 local_b8;
  vector<double,_std::allocator<double>_> local_b0 [2];
  value_type local_80;
  value_type local_78;
  value_type local_70;
  value_type *local_68;
  undefined8 local_60;
  vector<double,_std::allocator<double>_> local_58;
  undefined8 local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  vector<double,_std::allocator<double>_> *local_18;
  vector<double,_std::allocator<double>_> *local_10;
  
  local_28 = *(double *)(in_RDI + 0x90);
  local_30 = *(double *)(in_RDI + 0xc0);
  local_38 = *(double *)(in_RDI + 0xb0);
  local_40 = *(undefined8 *)(in_RDI + 0xb8);
  local_20 = in_XMM0_Qa;
  local_18 = in_RDX;
  local_10 = in_RSI;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,0);
  local_80 = *pvVar1;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](local_10,1);
  local_78 = *pvVar1;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](local_10,2);
  local_70 = *pvVar1;
  local_68 = &local_80;
  local_60 = 3;
  std::allocator<double>::allocator((allocator<double> *)0x1359f9);
  __l._M_len = (size_type)in_stack_fffffffffffff290;
  __l._M_array = (iterator)in_stack_fffffffffffff288;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff280,__l,
             (allocator_type *)in_stack_fffffffffffff278);
  std::allocator<double>::~allocator((allocator<double> *)0x135a2d);
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](local_10,3);
  local_d8 = *pvVar1;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](local_10,4);
  local_d0 = *pvVar1;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](local_10,5);
  local_c8 = *pvVar1;
  local_c0 = &local_d8;
  local_b8 = 3;
  std::allocator<double>::allocator((allocator<double> *)0x135abb);
  __l_00._M_len = (size_type)in_stack_fffffffffffff290;
  __l_00._M_array = (iterator)in_stack_fffffffffffff288;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff280,__l_00,
             (allocator_type *)in_stack_fffffffffffff278);
  std::allocator<double>::~allocator((allocator<double> *)0x135aef);
  local_e8 = *(double *)(in_RDI + 200);
  local_f0 = *(double *)(in_RDI + 0xd0);
  local_f8 = *(double *)(in_RDI + 0xd8);
  local_100 = *(double *)(in_RDI + 0xe0);
  local_108 = *(double *)(in_RDI + 0xe8);
  local_110 = *(double *)(in_RDI + 0xf0);
  local_118 = *(double *)(in_RDI + 0xf8);
  local_120 = *(double *)(in_RDI + 0x110);
  local_128 = *(double *)(in_RDI + 0xa8);
  local_130 = *(double *)(in_RDI + 0x98);
  local_138 = *(double *)(in_RDI + 0xa0);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0x135bbf);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0x135bce);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0x135bdd);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0x135bec);
  std::vector<double,_std::allocator<double>_>::operator[](local_10,0);
  std::vector<double,_std::allocator<double>_>::operator[](local_10,1);
  std::vector<double,_std::allocator<double>_>::operator[](local_10,2);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            (in_stack_fffffffffffff280,(Scalar *)in_stack_fffffffffffff278,
             (Scalar *)in_stack_fffffffffffff270,in_stack_fffffffffffff268);
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_58,0);
  dVar6 = pow(*pvVar2,2.0);
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_58,1);
  dVar7 = pow(*pvVar2,2.0);
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_58,2);
  local_1b8 = pow(*pvVar2,2.0);
  local_1b8 = dVar6 + dVar7 + local_1b8;
  local_1c0 = sqrt(local_1b8);
  local_1c8 = local_120 + local_20 / 86400.0;
  local_1d0 = 0.017453292519943295;
  local_218 = 0;
  uStack_210 = 0;
  local_208 = 0;
  local_1f8 = &local_218;
  local_1f0 = 3;
  std::allocator<double>::allocator((allocator<double> *)0x135dbb);
  __l_01._M_len = (size_type)in_stack_fffffffffffff290;
  __l_01._M_array = (iterator)in_stack_fffffffffffff288;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff280,__l_01,
             (allocator_type *)in_stack_fffffffffffff278);
  std::allocator<double>::~allocator((allocator<double> *)0x135def);
  if ((in_RDI[4] & 1) == 0) {
    dVar6 = -local_28;
    _Var8 = std::pow<double,int>
                      ((double)in_stack_fffffffffffff250,
                       (int)((ulong)in_stack_fffffffffffff248 >> 0x20));
    local_258 = dVar6 / _Var8;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_1e8,0);
    dVar9 = local_258;
    dVar6 = *pvVar2;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_58,0);
    dVar7 = *pvVar2;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_1e8,0);
    *pvVar2 = dVar9 * dVar7 + dVar6;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_1e8,1);
    dVar9 = local_258;
    dVar6 = *pvVar2;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_58,1);
    dVar7 = *pvVar2;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_1e8,1);
    *pvVar2 = dVar9 * dVar7 + dVar6;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_1e8,2);
    dVar9 = local_258;
    dVar6 = *pvVar2;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_58,2);
    dVar7 = *pvVar2;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_1e8,2);
    *pvVar2 = dVar9 * dVar7 + dVar6;
    if ((*in_RDI & 1) != 0) {
      std::vector<double,_std::allocator<double>_>::operator[](&local_58,0);
      local_260 = std::pow<double,int>
                            ((double)in_stack_fffffffffffff250,
                             (int)((ulong)in_stack_fffffffffffff248 >> 0x20));
      std::vector<double,_std::allocator<double>_>::operator[](&local_58,1);
      local_268 = std::pow<double,int>
                            ((double)in_stack_fffffffffffff250,
                             (int)((ulong)in_stack_fffffffffffff248 >> 0x20));
      std::vector<double,_std::allocator<double>_>::operator[](&local_58,2);
      local_270 = std::pow<double,int>
                            ((double)in_stack_fffffffffffff250,
                             (int)((ulong)in_stack_fffffffffffff248 >> 0x20));
      dVar6 = local_38;
      _Var8 = std::pow<double,int>
                        ((double)in_stack_fffffffffffff250,
                         (int)((ulong)in_stack_fffffffffffff248 >> 0x20));
      dVar9 = dVar6 * _Var8 * local_28;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_58,0);
      dVar6 = *pvVar2;
      dVar10 = local_260 + local_268;
      dVar12 = local_270 * -4.0;
      dVar11 = pow(dVar10 + local_270,3.5);
      dVar7 = local_38;
      local_278 = ((dVar9 * dVar6 * (dVar10 + dVar12)) / dVar11) * -1.5;
      _Var8 = std::pow<double,int>
                        ((double)in_stack_fffffffffffff250,
                         (int)((ulong)in_stack_fffffffffffff248 >> 0x20));
      dVar9 = dVar7 * _Var8 * local_28;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_58,1);
      dVar6 = *pvVar2;
      dVar10 = local_260 + local_268;
      dVar12 = local_270 * -4.0;
      dVar11 = pow(dVar10 + local_270,3.5);
      dVar7 = local_38;
      local_280 = ((dVar9 * dVar6 * (dVar10 + dVar12)) / dVar11) * -1.5;
      _Var8 = std::pow<double,int>
                        ((double)in_stack_fffffffffffff250,
                         (int)((ulong)in_stack_fffffffffffff248 >> 0x20));
      dVar7 = dVar7 * _Var8 * local_28;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_58,2);
      dVar6 = *pvVar2;
      dVar9 = pow(local_260 + local_268 + local_270,3.5);
      local_288 = ((dVar7 * dVar6 * 1.0) / dVar9) *
                  (-local_270 + -local_270 + local_260 * 3.0 + local_268 * 3.0) * -1.5;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_1e8,0);
      dVar6 = *pvVar2 + local_278;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_1e8,0);
      *pvVar2 = dVar6;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_1e8,1);
      dVar6 = *pvVar2 + local_280;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_1e8,1);
      *pvVar2 = dVar6;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_1e8,2);
      dVar6 = *pvVar2 + local_288;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_1e8,2);
      *pvVar2 = dVar6;
    }
  }
  else {
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff250,
               (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff248);
    Util::EGM96Grav::GetGravAccel
              (in_stack_fffffffffffff728,in_stack_fffffffffffff720,in_stack_fffffffffffff718);
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_1e8,0);
    dVar6 = *pvVar2;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffff250,(Index)in_stack_fffffffffffff248);
    dVar7 = *pSVar3;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_1e8,0);
    *pvVar2 = dVar6 + dVar7;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_1e8,1);
    dVar6 = *pvVar2;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffff250,(Index)in_stack_fffffffffffff248);
    dVar7 = *pSVar3;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_1e8,1);
    *pvVar2 = dVar6 + dVar7;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_1e8,2);
    dVar6 = *pvVar2;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffff250,(Index)in_stack_fffffffffffff248);
    dVar7 = *pSVar3;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_1e8,2);
    *pvVar2 = dVar6 + dVar7;
  }
  if ((in_RDI[1] & 1) != 0) {
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0x13676b);
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](local_b0,0);
    dVar9 = local_e8;
    dVar6 = *pvVar2;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_58,1);
    dVar7 = *pvVar2;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffff250,(Index)in_stack_fffffffffffff248);
    *pSVar3 = dVar9 * dVar7 + dVar6;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](local_b0,1);
    dVar9 = local_e8;
    dVar6 = *pvVar2;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_58,0);
    dVar7 = *pvVar2;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffff250,(Index)in_stack_fffffffffffff248);
    *pSVar3 = dVar6 - dVar9 * dVar7;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](local_b0,2);
    vVar21 = *pvVar2;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffff250,(Index)in_stack_fffffffffffff248);
    *pSVar3 = vVar21;
    local_2a8 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
                          ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                           in_stack_fffffffffffff248);
    dVar6 = local_108;
    local_2b0 = exp(-(local_1c0 - local_110) / local_118);
    local_2b0 = dVar6 * local_2b0;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_1e8,0);
    dVar6 = *pvVar2;
    dVar7 = local_f0 * 500.0 * local_f8 * local_2b0 * local_2a8;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffff250,(Index)in_stack_fffffffffffff248);
    dVar7 = (dVar7 * *pSVar3) / local_100;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_1e8,0);
    *pvVar2 = dVar6 - dVar7;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_1e8,1);
    dVar6 = *pvVar2;
    dVar7 = local_f0 * 500.0 * local_f8 * local_2b0 * local_2a8;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffff250,(Index)in_stack_fffffffffffff248);
    dVar7 = (dVar7 * *pSVar3) / local_100;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_1e8,1);
    *pvVar2 = dVar6 - dVar7;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_1e8,2);
    dVar6 = *pvVar2;
    dVar7 = local_f0 * 500.0 * local_f8 * local_2b0 * local_2a8;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffff250,(Index)in_stack_fffffffffffff248);
    dVar7 = (dVar7 * *pSVar3) / local_100;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_1e8,2);
    *pvVar2 = dVar6 - dVar7;
  }
  local_2b8 = (local_1c8 + -2451545.0) / 36525.0;
  dVar6 = local_2b8 * 36000.771285 + 280.46;
  local_2c8 = local_2b8 * 35999.050957 + 357.528;
  local_2c0 = dVar6;
  dVar7 = sin(local_2c8 * local_1d0);
  dVar9 = sin((local_2c8 + local_2c8) * local_1d0);
  local_2d0 = dVar9 * 0.019994643 + dVar7 * 1.914666471 + dVar6;
  dVar6 = cos(local_2c8 * local_1d0);
  dVar7 = cos((local_2c8 + local_2c8) * local_1d0);
  dVar6 = dVar7 * -0.000139589 + dVar6 * -0.016708617 + 1.000140612;
  local_2e0 = local_2b8 * -0.0130042 + 23.439291;
  local_2d8 = dVar6;
  dVar7 = cos(local_2d0 * local_1d0);
  dVar6 = dVar6 * dVar7 * local_128;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffff250,(Index)in_stack_fffffffffffff248);
  *pSVar3 = dVar6;
  dVar7 = local_2d8;
  dVar9 = cos(local_2e0 * local_1d0);
  dVar9 = dVar7 * dVar9;
  dVar6 = sin(local_2d0 * local_1d0);
  vel_00 = (Vector3d *)(dVar9 * dVar6 * local_128);
  pos_00 = (Vector3d *)
           Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffff250,(Index)in_stack_fffffffffffff248);
  (pos_00->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[0] =
       (double)vel_00;
  dVar6 = local_2d8;
  dVar10 = sin(local_2e0 * local_1d0);
  dVar10 = dVar6 * dVar10;
  dVar11 = sin(local_2d0 * local_1d0);
  dVar11 = dVar10 * dVar11 * local_128;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffff250,(Index)in_stack_fffffffffffff248);
  *pSVar3 = dVar11;
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (in_stack_fffffffffffff278,in_stack_fffffffffffff270);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff250,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)in_stack_fffffffffffff248);
  local_2f9 = 1;
  if ((in_RDI[2] & 1) != 0) {
    local_308 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
                dot<Eigen::Matrix<double,3,1,0,3,1>>
                          ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                           in_stack_fffffffffffff250,
                           (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                           in_stack_fffffffffffff248);
    if (local_308 < 0.0) {
      local_310 = local_1d0 * 0.269007205;
      dVar12 = -local_308;
      RVar13 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
                         ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                          in_stack_fffffffffffff248);
      RVar14 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
                         ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                          in_stack_fffffffffffff248);
      local_318 = acos(dVar12 / (RVar13 * RVar14));
      RVar13 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
                         ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                          in_stack_fffffffffffff248);
      local_320 = cos(local_318);
      local_320 = RVar13 * local_320;
      RVar13 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
                         ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                          in_stack_fffffffffffff248);
      local_328 = sin(local_318);
      dVar12 = local_30;
      local_328 = RVar13 * local_328;
      local_330 = sin(local_310);
      local_330 = dVar12 / local_330;
      local_338 = tan(local_310);
      local_338 = local_338 * (local_330 + local_320);
      if (local_328 <= local_338) {
        local_2f9 = 0;
      }
    }
    if ((local_2f9 & 1) != 0) {
      local_340 = 27.0;
      local_348 = pow(10.0,-6.0);
      local_348 = local_348 * 4.57;
      local_388 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
                            ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                             in_stack_fffffffffffff248);
      Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator/
                (in_stack_fffffffffffff298,(double *)in_stack_fffffffffffff290);
      Eigen::Matrix<double,3,1,0,3,1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
                ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff250,
                 (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                  *)in_stack_fffffffffffff248);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_1e8,0);
      dVar12 = *pvVar2;
      dVar15 = local_340 * local_348;
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                          in_stack_fffffffffffff250,(Index)in_stack_fffffffffffff248);
      dVar16 = *pSVar4;
      dVar20 = local_100 * -1000.0;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_1e8,0);
      *pvVar2 = dVar12 + (dVar15 * dVar16) / dVar20;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_1e8,1);
      dVar12 = *pvVar2;
      dVar15 = local_340 * local_348;
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                          in_stack_fffffffffffff250,(Index)in_stack_fffffffffffff248);
      dVar16 = *pSVar4;
      dVar20 = local_100 * -1000.0;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_1e8,1);
      *pvVar2 = dVar12 + (dVar15 * dVar16) / dVar20;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_1e8,2);
      dVar12 = *pvVar2;
      dVar15 = local_340 * local_348;
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                          in_stack_fffffffffffff250,(Index)in_stack_fffffffffffff248);
      dVar16 = *pSVar4;
      dVar20 = local_100 * 1000.0;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_1e8,2);
      *pvVar2 = dVar12 - (dVar15 * dVar16) / dVar20;
    }
  }
  if ((in_RDI[3] & 1) != 0) {
    local_390 = (local_1c8 + -2451545.0) / 36525.0;
    dVar12 = local_390 * 481267.8813;
    dVar16 = sin(local_1d0 * (local_390 * 477198.85 + 134.9));
    dVar15 = sin(local_1d0 * (local_390 * -413335.38 + 259.2));
    dVar20 = sin(local_1d0 * (local_390 * 890543.23 + 235.7));
    dVar17 = sin(local_1d0 * (local_390 * 954397.7 + 269.9));
    dVar18 = sin(local_1d0 * (local_390 * 35999.05 + 357.5));
    dVar19 = sin(local_390 * 966404.05 + 186.6);
    local_398 = dVar19 * -0.11 +
                dVar18 * -0.19 +
                dVar17 * 0.21 + dVar20 * 0.66 + dVar15 * -1.27 + dVar16 * 6.29 + dVar12 + 218.32;
    dVar12 = sin(local_1d0 * (local_390 * 483202.03 + 93.3));
    dVar16 = sin(local_1d0 * (local_390 * 960400.87 + 228.2));
    dVar15 = sin(local_1d0 * (local_390 * 6003.18 + 318.3));
    dVar20 = sin(local_1d0 * (local_390 * -407332.2 + 217.6));
    local_3a0 = dVar20 * -0.17 + dVar15 * -0.28 + dVar12 * 5.13 + dVar16 * 0.28;
    dVar12 = cos(local_1d0 * (local_390 * 477198.85 + 134.9));
    dVar16 = cos(local_1d0 * (local_390 * -413335.38 + 259.2));
    dVar15 = cos(local_1d0 * (local_390 * 890534.23 + 235.7));
    dVar20 = cos(local_1d0 * (local_390 * 954397.7 + 269.9));
    local_3a8 = dVar20 * 0.0028 + dVar15 * 0.0078 + dVar16 * 0.0095 + dVar12 * 0.0518 + 0.9508;
    dVar12 = local_390 * -0.0130042;
    dVar15 = pow(10.0,-7.0);
    dVar20 = pow(local_390,2.0);
    dVar17 = pow(10.0,-7.0);
    dVar18 = pow(local_390,3.0);
    dVar16 = local_30;
    local_3b0 = dVar17 * 5.04 * dVar18 + dVar12 + 23.439291 + dVar15 * -1.64 * dVar20;
    dVar15 = sin(local_1d0 * local_3a8);
    local_3b8 = dVar16 / dVar15;
    dVar20 = cos(local_1d0 * local_3a0);
    dVar17 = cos(local_1d0 * local_398);
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffff250,(Index)in_stack_fffffffffffff248);
    dVar12 = local_3b8;
    *pSVar4 = (dVar16 / dVar15) * dVar20 * dVar17;
    dVar15 = cos(local_3b0 * local_1d0);
    dVar20 = cos(local_1d0 * local_3a0);
    dVar17 = sin(local_1d0 * local_398);
    dVar18 = sin(local_1d0 * local_3b0);
    dVar19 = sin(local_1d0 * local_3a0);
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffff250,(Index)in_stack_fffffffffffff248);
    dVar16 = local_3b8;
    *pSVar4 = dVar12 * (dVar15 * dVar20 * dVar17 - dVar18 * dVar19);
    dVar12 = sin(local_3b0 * local_1d0);
    dVar15 = cos(local_1d0 * local_3a0);
    dVar20 = sin(local_1d0 * local_398);
    dVar17 = cos(local_1d0 * local_3b0);
    dVar18 = sin(local_1d0 * local_3a0);
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffff250,(Index)in_stack_fffffffffffff248);
    *pSVar4 = dVar16 * (dVar12 * dVar15 * dVar20 + dVar17 * dVar18);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
              (in_stack_fffffffffffff278,in_stack_fffffffffffff270);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff250,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)in_stack_fffffffffffff248);
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_58,0);
    dVar12 = pow(*pvVar2,2.0);
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_58,1);
    dVar16 = pow(*pvVar2,2.0);
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_58,2);
    local_3d8 = pow(*pvVar2,2.0);
    local_3d8 = dVar12 + dVar16 + local_3d8;
    local_3e0 = sqrt(local_3d8);
    RVar13 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
                       ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                        in_stack_fffffffffffff248);
    local_3e8 = pow(RVar13,3.0);
    local_3f0 = pow(local_128 * local_2d8,3.0);
    RVar13 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
                       ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                        in_stack_fffffffffffff248);
    local_3f8 = pow(RVar13,3.0);
    local_400 = pow(local_3b8,3.0);
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_1e8,0);
    dVar16 = local_130;
    dVar12 = *pvVar2;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffff250,(Index)in_stack_fffffffffffff248);
    dVar15 = *pSVar4 / local_3e8;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffff250,(Index)in_stack_fffffffffffff248);
    dVar20 = *pSVar4 / local_3f0;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_1e8,0);
    *pvVar2 = dVar16 * (dVar15 - dVar20) + dVar12;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_1e8,1);
    dVar16 = local_130;
    dVar12 = *pvVar2;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffff250,(Index)in_stack_fffffffffffff248);
    dVar15 = *pSVar4 / local_3e8;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffff250,(Index)in_stack_fffffffffffff248);
    dVar20 = *pSVar4 / local_3f0;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_1e8,1);
    *pvVar2 = dVar16 * (dVar15 - dVar20) + dVar12;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_1e8,2);
    dVar16 = local_130;
    dVar12 = *pvVar2;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffff250,(Index)in_stack_fffffffffffff248);
    dVar15 = *pSVar4 / local_3e8;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffff250,(Index)in_stack_fffffffffffff248);
    dVar20 = *pSVar4 / local_3f0;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_1e8,2);
    *pvVar2 = dVar16 * (dVar15 - dVar20) + dVar12;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_1e8,0);
    dVar16 = local_138;
    dVar12 = *pvVar2;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffff250,(Index)in_stack_fffffffffffff248);
    dVar15 = *pSVar4 / local_3f8;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffff250,(Index)in_stack_fffffffffffff248);
    dVar20 = *pSVar4 / local_400;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_1e8,0);
    *pvVar2 = dVar16 * (dVar15 - dVar20) + dVar12;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_1e8,1);
    dVar16 = local_138;
    dVar12 = *pvVar2;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffff250,(Index)in_stack_fffffffffffff248);
    dVar15 = *pSVar4 / local_3f8;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffff250,(Index)in_stack_fffffffffffff248);
    dVar20 = *pSVar4 / local_400;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_1e8,1);
    *pvVar2 = dVar16 * (dVar15 - dVar20) + dVar12;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_1e8,2);
    dVar16 = local_138;
    dVar12 = *pvVar2;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffff250,(Index)in_stack_fffffffffffff248);
    dVar15 = *pSVar4 / local_3f8;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffff250,(Index)in_stack_fffffffffffff248);
    dVar20 = *pSVar4 / local_400;
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_1e8,2);
    *pvVar2 = dVar16 * (dVar15 - dVar20) + dVar12;
  }
  dVar12 = local_108;
  if ((in_RDI[0x130] & 1) != 0) {
    local_408 = exp(-(local_1c0 - local_110) / local_118);
    local_408 = dVar12 * local_408;
    local_410 = (local_f0 * 500000.0 * local_f8 * local_408) / local_100;
    local_430 = std::vector<double,_std::allocator<double>_>::data
                          ((vector<double,_std::allocator<double>_> *)0x138797);
    Eigen::Matrix<double,3,1,0,3,1>::Matrix<double*>
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff250,
               (double **)in_stack_fffffffffffff248);
    local_450 = std::vector<double,_std::allocator<double>_>::data
                          ((vector<double,_std::allocator<double>_> *)0x1387c3);
    Eigen::Matrix<double,3,1,0,3,1>::Matrix<double*>
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff250,
               (double **)in_stack_fffffffffffff248);
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff250,
               (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff248);
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff250,
               (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffff248);
    Util::GetGravJac(pos_00,vel_00,dVar9,dVar7,(double)pSVar3,dVar11,dVar10,dVar6);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
              ((Index)in_stack_fffffffffffff258,(Index)in_stack_fffffffffffff250);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
              ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff250,
               (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                *)in_stack_fffffffffffff248);
    for (local_4cc = 0; local_4cc < 6; local_4cc = local_4cc + 1) {
      std::allocator<double>::allocator((allocator<double> *)0x1388cd);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff270,
                 (size_type)in_stack_fffffffffffff268,
                 (value_type_conflict1 *)in_stack_fffffffffffff260,in_stack_fffffffffffff258);
      std::allocator<double>::~allocator((allocator<double> *)0x1388fe);
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                         (local_10,(long)(local_4cc * 6 + 6));
      vVar21 = *pvVar1;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_4e8,0);
      *pvVar2 = vVar21;
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                         (local_10,(long)(local_4cc * 6 + 7));
      vVar21 = *pvVar1;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_4e8,1);
      *pvVar2 = vVar21;
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                         (local_10,(long)(local_4cc * 6 + 8));
      vVar21 = *pvVar1;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_4e8,2);
      *pvVar2 = vVar21;
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                         (local_10,(long)(local_4cc * 6 + 9));
      vVar21 = *pvVar1;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_4e8,3);
      *pvVar2 = vVar21;
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                         (local_10,(long)(local_4cc * 6 + 10));
      vVar21 = *pvVar1;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_4e8,4);
      *pvVar2 = vVar21;
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                         (local_10,(long)(local_4cc * 6 + 0xb));
      vVar21 = *pvVar1;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_4e8,5);
      *pvVar2 = vVar21;
      std::vector<double,_std::allocator<double>_>::vector
                (in_stack_fffffffffffff2a0,
                 (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff298);
      Util::StdVec2Eigen(in_stack_fffffffffffff288);
      std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff260);
      Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,int>
                (in_stack_fffffffffffff290,(Index)in_stack_fffffffffffff288,
                 (Index)in_stack_fffffffffffff280,(int)((ulong)in_stack_fffffffffffff278 >> 0x20),
                 (int)in_stack_fffffffffffff278);
      Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)
                 in_stack_fffffffffffff250,
                 (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff248);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x138b67);
      std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff260);
    }
    Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
              (in_stack_fffffffffffff250,
               (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff248);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::
    Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
              ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff250,
               in_stack_fffffffffffff248);
    for (local_584 = 0; local_584 < 6; local_584 = local_584 + 1) {
      Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,int>
                (in_stack_fffffffffffff290,(Index)in_stack_fffffffffffff288,
                 (Index)in_stack_fffffffffffff280,(int)((ulong)in_stack_fffffffffffff278 >> 0x20),
                 (int)in_stack_fffffffffffff278);
      Eigen::Matrix<double,-1,1,0,-1,1>::
      Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>>
                ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffff250,
                 (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>
                  *)in_stack_fffffffffffff248);
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          in_stack_fffffffffffff250,(Index)in_stack_fffffffffffff248);
      SVar22 = *pSVar5;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         (local_18,(long)(local_584 * 6 + 6));
      *pvVar2 = SVar22;
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          in_stack_fffffffffffff250,(Index)in_stack_fffffffffffff248);
      SVar22 = *pSVar5;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         (local_18,(long)(local_584 * 6 + 7));
      *pvVar2 = SVar22;
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          in_stack_fffffffffffff250,(Index)in_stack_fffffffffffff248);
      SVar22 = *pSVar5;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         (local_18,(long)(local_584 * 6 + 8));
      *pvVar2 = SVar22;
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          in_stack_fffffffffffff250,(Index)in_stack_fffffffffffff248);
      in_stack_fffffffffffff290 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)*pSVar5;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         (local_18,(long)(local_584 * 6 + 9));
      *pvVar2 = (value_type)in_stack_fffffffffffff290;
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          in_stack_fffffffffffff250,(Index)in_stack_fffffffffffff248);
      in_stack_fffffffffffff280 = (Matrix<double,_3,_1,_0,_3,_1> *)*pSVar5;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         (local_18,(long)(local_584 * 6 + 10));
      *pvVar2 = (value_type)in_stack_fffffffffffff280;
      in_stack_fffffffffffff288 =
           (vector<double,_std::allocator<double>_> *)
           Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                      in_stack_fffffffffffff250,(Index)in_stack_fffffffffffff248);
      in_stack_fffffffffffff278 =
           (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
           (in_stack_fffffffffffff288->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         (local_18,(long)(local_584 * 6 + 0xb));
      *pvVar2 = (value_type)in_stack_fffffffffffff278;
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x138efe);
    }
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x138f70)
    ;
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x138f7d)
    ;
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x138f8a)
    ;
  }
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](local_b0,0);
  vVar21 = *pvVar2;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](local_18,0);
  *pvVar2 = vVar21;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](local_b0,1);
  vVar21 = *pvVar2;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](local_18,1);
  *pvVar2 = vVar21;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](local_b0,2);
  vVar21 = *pvVar2;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](local_18,2);
  *pvVar2 = vVar21;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_1e8,0);
  this_00 = (vector<double,_std::allocator<double>_> *)*pvVar2;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](local_18,3);
  *pvVar2 = (value_type)this_00;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_1e8,1);
  vVar21 = *pvVar2;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](local_18,4);
  *pvVar2 = vVar21;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_1e8,2);
  vVar21 = *pvVar2;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](local_18,5);
  *pvVar2 = vVar21;
  std::vector<double,_std::allocator<double>_>::~vector(this_00);
  std::vector<double,_std::allocator<double>_>::~vector(this_00);
  std::vector<double,_std::allocator<double>_>::~vector(this_00);
  return;
}

Assistant:

void Propagator::operator()  (const state_type &x , state_type &dxdt , const double t){
		
		//extract locals
		double mu = this->mu_;
		double Rearth = this->Rearth_;
		double J2 = this->J2_;
		double J3 = this->J3_;
		state_type pos = {x[0], x[1], x[2]};
		state_type vel = {x[3], x[4], x[5]};
		double earthrot = this->earthrotationspeed_;
		double C_D = this->C_D_; // coefficient of drag
		double A = this->A_; // effective area, m^2
		double m = this->m_; // vehicle mass, kg
		double rho_0 = this->rho_0_; // standard air density, kg/m^3
		double r0 = this->r0_; // param for air density calc, km
		double H = this->H_; //param for air density calc, km
		double t_JD_init = this->t_JD_; //UTC julian date at initialization
		double AU2km = this->AU_;
		double mu_sun = this->mu_sun_;
		double mu_moon = this->mu_moon_;

		//initialize some variables we may need
		Eigen::Vector3d r_sun_ECI; //position of the sun in ECI frame [km]
		Eigen::Vector3d r_craft2sun; //ECI position from craft to sun [km]
		Eigen::Vector3d r_moon_ECI; //position of the moon in ECI frame [km]
		Eigen::Vector3d r_craft2moon; //ECI position from craft to moon [km]
		Eigen::Vector3d r_craft(x[0], x[1], x[2]); //eigen position vector for spacecraft [km]

		//intermediate calcs
		double r2 = pow(pos[0],2.0) + pow(pos[1],2.0) + pow(pos[2],2.0);
		double r = sqrt(r2);
		double JD_UTC = t_JD_init + t/(24.0*60.0*60.0); //current UTC Julian Date in days
		double d2r = M_PI/180.0; //degrees to radians

		// std::cout << "t: " << t << " state: " << x[0] << " " << x[1] << " " << x[2] << " " << x[3] << " " << x[4] << " " << x[5]; 

		//initalize acceleration
		state_type accel = {0.0, 0.0, 0.0};
		
		if(this->use20x20_){

			Eigen::Vector3d accelinit = this->gravmodel_->GetGravAccel(r_craft, JD_UTC);

			accel[0] = accel[0] + accelinit[0];
			accel[1] = accel[1] + accelinit[1];
			accel[2] = accel[2] + accelinit[2];

		} else {

			//two body acceleration
			double k = -mu/pow(r,3);
			accel[0] = accel[0] + k*pos[0];
			accel[1] = accel[1] + k*pos[1];
			accel[2] = accel[2] + k*pos[2];

			if (this->useJ2_) { // J-2 accel
				
				double t2 = pow(pos[0],2);
				double t3 = pow(pos[1],2);
				double t4 = pow(pos[2],2);
				double accel_j2_x = J2*pow(Rearth,2)*mu*pos[0]*(t2+t3-t4*4.0)*1.0/pow(t2+t3+t4,7.0/2.0)*(-3.0/2.0);
				double accel_j2_y = J2*pow(Rearth,2)*mu*pos[1]*(t2+t3-t4*4.0)*1.0/pow(t2+t3+t4,7.0/2.0)*(-3.0/2.0);
				double accel_j2_z = J2*pow(Rearth,2)*mu*pos[2]*1.0/pow(t2+t3+t4,7.0/2.0)*(t2*3.0+t3*3.0-t4*2.0)*(-3.0/2.0);

				// add J2 acceleration
				accel[0] = accel[0] + accel_j2_x;
				accel[1] = accel[1] + accel_j2_y;
				accel[2] = accel[2] + accel_j2_z;
			} // fi

		}	

		if (this->usedrag_) { // drag acceleration 
			
			//relative wind vector
			Eigen::Vector3d V_A;
			V_A[0] = vel[0] + earthrot*pos[1];
			V_A[1] = vel[1] - earthrot*pos[0];
			V_A[2] = vel[2];
			double nV_A = V_A.norm(); //magnitude

			//current air density
			double rho_A = rho_0*exp(-(r - r0)/H);

			//add drag acceleration (extra 1000 for unit conversion)
			accel[0] = accel[0] - 1000.0*0.5*C_D*A*rho_A*nV_A*V_A[0]/m;
			accel[1] = accel[1] - 1000.0*0.5*C_D*A*rho_A*nV_A*V_A[1]/m;
			accel[2] = accel[2] - 1000.0*0.5*C_D*A*rho_A*nV_A*V_A[2]/m;

		} //fi

		//first, find the position of the sun in the ECI frame (vallado algo 29)

		//assume JD_UTC = JD_UT1 (less than 1 second deviation)
		double T_UT1 = (JD_UTC - 2451545.0)/36525.0; // julian centuries
		// double T_UT1 = (2453827.5 - 2451545.0)/36525.0; // vallado numbers for checking
		double lambda_M_sun = 280.460 + 36000.771285*T_UT1; // mean sun longitude [degrees]

		//assume T_TBD = T_UT1
		double M_sun = 357.528 + 35999.050957*T_UT1; // mean sun something [degrees]
		double lambda_ecliptic = lambda_M_sun + 1.914666471*sin(M_sun*d2r) + 0.019994643*sin(2*M_sun*d2r);

		//norm of position to sun [AU]
		double r_sun_ECI_norm = 1.000140612 - 0.016708617*cos(M_sun*d2r) - 0.000139589*cos(2*M_sun*d2r);
		double eps = 23.439291 - 0.0130042*T_UT1; //ecentricity of sun orbit?

		//position of sun
		r_sun_ECI[0] = r_sun_ECI_norm*cos(lambda_ecliptic*d2r)*AU2km;
		r_sun_ECI[1] = r_sun_ECI_norm*cos(eps*d2r)*sin(lambda_ecliptic*d2r)*AU2km;
		r_sun_ECI[2] = r_sun_ECI_norm*sin(eps*d2r)*sin(lambda_ecliptic*d2r)*AU2km;

		//relative direction of sun in ECI frame
		r_craft2sun = r_sun_ECI - r_craft;

		bool in_sun = true; //boolean to track if we are in the sun or not

		if (this->useSRP_) { //SRP acceleration

			//check to see if we are in the earth's shadow (vallado algo 34)
			double sundotcraft = r_sun_ECI.dot(r_craft);
			if (sundotcraft < 0)	{ // if positive we are between sun and earth

				//constants for earth shadow
				double alpha_pen = 0.269007205*d2r;
				
				//find the angle between the two [radians]
				double xi = acos(-1.0*sundotcraft/(r_sun_ECI.norm()*r_craft.norm()));

				//satellite horizontal and vertical position
				double sat_horiz = r_craft.norm()*cos(xi);
				double sat_vert = r_craft.norm()*sin(xi);

				double x = Rearth/sin(alpha_pen);

				double pen_vert = tan(alpha_pen)*(x+sat_horiz);
				if(sat_vert <= pen_vert) {
					in_sun = false; //consider only penumbra
				} //fi

			} //fi

			//if we are in the sun, add the SRP force
			if (in_sun)	{
				
				//approximate Area * C_s
				// double SRPcoeff = 0.04*15.0 + 0.59*7.0;
				double SRPcoeff = 1.8*15.0;

				//vallado srp
				double p_srp = 4.57*pow(10.0,-6.0);

				//normalize
				Eigen::Vector3d r_craft2sun_norm = r_craft2sun/r_craft2sun.norm();

				//add SRP acceleration (extra 1000 for unit conversion)
				accel[0] = accel[0] - SRPcoeff*p_srp*r_craft2sun_norm[0]/(1000.0*m);
				accel[1] = accel[1] - SRPcoeff*p_srp*r_craft2sun_norm[1]/(1000.0*m);
				accel[2] = accel[2] - SRPcoeff*p_srp*r_craft2sun_norm[2]/(1000.0*m);
			}


		} //fi

		if (this->useLuniSolar_) { //gravitational effects of the sun and moon

			//first, find the position of the moon in the ECI frame (vallado algo 31)

			//assume JD_UTC = JD_TBD
			// double T_TBD = (2449470.5 - 2451545.0)/36525.0; // vallado numbers
			double T_TBD = (JD_UTC - 2451545.0)/36525.0; // julian centuries
			
			double lambda_ecliptic = 218.32 + 481267.8813*T_TBD + 6.29*sin(d2r*(134.9 + 477198.85*T_TBD))
				- 1.27*sin(d2r*(259.2 - 413335.38*T_TBD)) + 0.66*sin(d2r*(235.7 + 890543.23*T_TBD))
				+ 0.21*sin(d2r*(269.9+954397.70*T_TBD)) - 0.19*sin(d2r*(357.5 + 35999.05*T_TBD))
				- 0.11*sin(186.6 + 966404.05*T_TBD);

			double phi_ecliptic = 5.13*sin(d2r*(93.3 + 483202.03*T_TBD)) + 0.28*sin(d2r*(228.2 + 960400.87*T_TBD))
				- 0.28*sin(d2r*(318.3 + 6003.18*T_TBD)) - 0.17*sin(d2r*(217.6 - 407332.20*T_TBD));

			double D = 0.9508 + 0.0518*cos(d2r*(134.9 + 477198.85*T_TBD)) + 0.0095*cos(d2r*(259.2 - 413335.38*T_TBD))
				+ 0.0078*cos(d2r*(235.7 + 890534.23*T_TBD)) + 0.0028*cos(d2r*(269.9 + 954397.70*T_TBD));

			double eps = 23.439291 - 0.0130042*T_TBD - 1.64*pow(10.0,-7.0)*pow(T_TBD,2.0) + 5.04*pow(10.0,-7.0)*pow(T_TBD,3.0);

			double r_moon_ECI_norm = Rearth/sin(d2r*D);

			r_moon_ECI[0] = r_moon_ECI_norm*cos(d2r*phi_ecliptic)*cos(d2r*lambda_ecliptic);
			r_moon_ECI[1] = r_moon_ECI_norm*(cos(eps*d2r)*cos(d2r*phi_ecliptic)*sin(d2r*lambda_ecliptic) - sin(d2r*eps)*sin(d2r*phi_ecliptic));
			r_moon_ECI[2] = r_moon_ECI_norm*(sin(eps*d2r)*cos(d2r*phi_ecliptic)*sin(d2r*lambda_ecliptic) + cos(d2r*eps)*sin(d2r*phi_ecliptic));

			//relative direction of moon in ECI frame
			r_craft2moon = r_moon_ECI - r_craft;

			//intermediate calcs
			double r2 = pow(pos[0],2.0) + pow(pos[1],2.0) + pow(pos[2],2.0);
			double r = sqrt(r2);
			double r3craft2sun = pow(r_craft2sun.norm(),3.0);
			double r3earth2sun = pow(AU2km*r_sun_ECI_norm,3.0);
			double r3craft2moon = pow(r_craft2moon.norm(),3.0);
			double r3earth2moon = pow(r_moon_ECI_norm,3.0);

			// std::cout << "\n" << accel[0] << ", " << accel[1] << ", " << accel[2] << "\n";

			//two body acceleration to sun
			accel[0] = accel[0] + mu_sun*(r_craft2sun[0]/r3craft2sun - r_sun_ECI[0]/r3earth2sun);
			accel[1] = accel[1] + mu_sun*(r_craft2sun[1]/r3craft2sun - r_sun_ECI[1]/r3earth2sun);
			accel[2] = accel[2] + mu_sun*(r_craft2sun[2]/r3craft2sun - r_sun_ECI[2]/r3earth2sun);

			// std::cout << "\n" << accel[0] << ", " << accel[1] << ", " << accel[2] << "\n";

			//two body acceleration to moon
			accel[0] = accel[0] + mu_moon*(r_craft2moon[0]/r3craft2moon - r_moon_ECI[0]/r3earth2moon);
			accel[1] = accel[1] + mu_moon*(r_craft2moon[1]/r3craft2moon - r_moon_ECI[1]/r3earth2moon);
			accel[2] = accel[2] + mu_moon*(r_craft2moon[2]/r3craft2moon - r_moon_ECI[2]/r3earth2moon);

			// std::cout << "\n" << accel[0] << ", " << accel[1] << ", " << accel[2] << "\n";
			// exit(0);
			
		}

		//integrate the STM if needed
		if (this->intSTM_) {

			//current air density
			double rho_A = rho_0*exp(-(r - r0)/H);
			double drag_coeff = 1000.0*1000.0*0.5*C_D*A*rho_A/m;

			//get the jacobian
			Eigen::Vector3d eigpos(pos.data());
			Eigen::Vector3d eigvel(vel.data());
			Eigen::MatrixXd jac = Util::GetGravJac(eigpos, eigvel, Rearth, earthrot, mu, J2, J3, drag_coeff);

			//extract the STM
			Eigen::MatrixXd STM = Eigen::MatrixXd::Zero(6,6);

			for (int ii = 0; ii < 6; ++ii) {

				std::vector<double> col(6,0);
				col[0] = x[6*ii + 0 + 6];
				col[1] = x[6*ii + 1 + 6];
				col[2] = x[6*ii + 2 + 6];
				col[3] = x[6*ii + 3 + 6];
				col[4] = x[6*ii + 4 + 6];
				col[5] = x[6*ii + 5 + 6];

				//convert to eigen
				Eigen::VectorXd eigcol = Util::StdVec2Eigen(col);

				//assign
				STM.block(0,ii,6,1) = eigcol;

			} // for


			//change in STM
			Eigen::MatrixXd dSTM = jac*STM;

			//assign
			for (int ii = 0; ii < 6; ++ii) {
				Eigen::VectorXd eigcol = dSTM.block(0,ii,6,1);

				dxdt[6*ii + 0 + 6] = eigcol[0];
				dxdt[6*ii + 1 + 6] = eigcol[1];
				dxdt[6*ii + 2 + 6] = eigcol[2];
				dxdt[6*ii + 3 + 6] = eigcol[3];
				dxdt[6*ii + 4 + 6] = eigcol[4];
				dxdt[6*ii + 5 + 6] = eigcol[5];

			} // for


			
		} //fi


		//change in state
		dxdt[0] = vel[0];
		dxdt[1] = vel[1];
		dxdt[2] = vel[2];
		dxdt[3] = accel[0];
		dxdt[4] = accel[1];
		dxdt[5] = accel[2];

		// std::cout << "simple accel: \n" << accel[0] << "\n" << accel[1] << "\n" << accel[2] << "\n";

		// exit(0);

	}